

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-string.h
# Opt level: O0

ostream * testing::internal::operator<<(ostream *os,String *str)

{
  char *pcVar1;
  size_t sVar2;
  String *in_RSI;
  ostream *in_RDI;
  size_t i;
  char *c_str;
  size_t local_20;
  
  pcVar1 = String::c_str(in_RSI);
  if (pcVar1 == (char *)0x0) {
    std::operator<<(in_RDI,"(null)");
  }
  else {
    pcVar1 = String::c_str(in_RSI);
    for (local_20 = 0; sVar2 = String::length(in_RSI), local_20 != sVar2; local_20 = local_20 + 1) {
      if (pcVar1[local_20] == '\0') {
        std::operator<<(in_RDI,"\\0");
      }
      else {
        std::operator<<(in_RDI,pcVar1[local_20]);
      }
    }
  }
  return in_RDI;
}

Assistant:

inline ::std::ostream& operator<<(::std::ostream& os, const String& str) {
  if (str.c_str() == NULL) {
    os << "(null)";
  } else {
    const char* const c_str = str.c_str();
    for (size_t i = 0; i != str.length(); i++) {
      if (c_str[i] == '\0') {
        os << "\\0";
      } else {
        os << c_str[i];
      }
    }
  }
  return os;
}